

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::TagSet::matches
          (TagSet *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&tags->_M_t,(key_type *)(p_Var2 + 1));
    if (((_Rb_tree_header *)cVar1._M_node != &(tags->_M_t)._M_impl.super__Rb_tree_header) ==
        (bool)(char)p_Var2[3]._M_color) break;
  }
  return (_Rb_tree_header *)p_Var2 == p_Var3;
}

Assistant:

bool matches( const std::set<std::string>& tags ) const {
            TagMap::const_iterator it = m_tags.begin();
            TagMap::const_iterator itEnd = m_tags.end();
            for(; it != itEnd; ++it ) {
                bool found = tags.find( it->first ) != tags.end();
                if( found == it->second.isNegated() )
                    return false;
            }
            return true;
        }